

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testing.c
# Opt level: O2

int testing_is_uniprocessor(testing t)

{
  char *pcVar1;
  uint uVar2;
  long lVar3;
  closure *pcVar4;
  closure_t_uniprocessor_check_1 a1;
  closure_t_uniprocessor_check_1 a1_00;
  testing_base_s *ptVar5;
  nsync_time nVar6;
  nsync_atomic_uint32_ state;
  is_uniprocessor_s s [3];
  
  nsync_mu_lock(&t->base->testing_mu);
  ptVar5 = t->base;
  uVar2 = ptVar5->is_uniprocessor;
  if (uVar2 == 0xffffffff) {
    for (lVar3 = 8; lVar3 != 0x338; lVar3 = lVar3 + 0x110) {
      *(undefined8 *)(&stack0xfffffffffffffcb0 + lVar3) = 0;
      pcVar1 = s[0].dummy + lVar3 + -0xc;
      pcVar1[0] = '\0';
      pcVar1[1] = '\0';
      pcVar1[2] = '\0';
      pcVar1[3] = '\0';
    }
    state = 0;
    pcVar4 = closure_uniprocessor_check
                       ((_func_void_closure_t_uniprocessor_check_0_closure_t_uniprocessor_check_1 *)
                        &state,(closure_t_uniprocessor_check_0)s,a1);
    closure_fork(pcVar4);
    nVar6 = nsync_time_ms(100);
    nsync_time_sleep(nVar6);
    state = 1;
    nVar6 = nsync_time_ms(400);
    nVar6 = nsync_time_sleep(nVar6);
    do {
    } while (s[0].done == 0);
    state = 0;
    pcVar4 = closure_uniprocessor_check
                       ((_func_void_closure_t_uniprocessor_check_0_closure_t_uniprocessor_check_1 *)
                        &state,(closure_t_uniprocessor_check_0)(s + 1),
                        (closure_t_uniprocessor_check_1)nVar6.tv_nsec);
    closure_fork(pcVar4);
    pcVar4 = closure_uniprocessor_check
                       ((_func_void_closure_t_uniprocessor_check_0_closure_t_uniprocessor_check_1 *)
                        &state,(closure_t_uniprocessor_check_0)(s + 2),a1_00);
    closure_fork(pcVar4);
    nVar6 = nsync_time_ms(100);
    nsync_time_sleep(nVar6);
    state = 1;
    nVar6 = nsync_time_ms(400);
    nsync_time_sleep(nVar6);
    state = 2;
    do {
      do {
      } while (s[1].done == 0);
    } while (s[2].done == 0);
    uVar2 = (uint)((s[1].count + s[2].count) / s[0].count < 1.7);
    ptVar5 = t->base;
    ptVar5->is_uniprocessor = uVar2;
  }
  nsync_mu_unlock(&ptVar5->testing_mu);
  return uVar2;
}

Assistant:

int testing_is_uniprocessor (testing t) {
	int is_uniprocessor;
	nsync_mu_lock (&t->base->testing_mu);
	is_uniprocessor = t->base->is_uniprocessor;
	if (is_uniprocessor == -1) {
		int i;
		struct is_uniprocessor_s s[3];
		nsync_atomic_uint32_ state;
		for (i = 0; i != 3; i++) {
			s[i].count = 0.0;
			s[i].done = 0;
		}

		ATM_STORE_REL (&state, 0);
		closure_fork (closure_uniprocessor_check (&uniprocessor_check, &state, &s[0]));
		nsync_time_sleep (nsync_time_ms (100));
		ATM_STORE_REL (&state, 1);
		nsync_time_sleep (nsync_time_ms (400));
		ATM_STORE_REL (&state, 2);
		while (!ATM_LOAD_ACQ (&s[0].done)) {
		}

		ATM_STORE_REL (&state, 0);
		closure_fork (closure_uniprocessor_check (&uniprocessor_check, &state, &s[1]));
		closure_fork (closure_uniprocessor_check (&uniprocessor_check, &state, &s[2]));
		nsync_time_sleep (nsync_time_ms (100));
		ATM_STORE_REL (&state, 1);
		nsync_time_sleep (nsync_time_ms (400));
		ATM_STORE_REL (&state, 2);
		while (!ATM_LOAD_ACQ (&s[1].done) || !ATM_LOAD_ACQ (&s[2].done)) {
		}
                t->base->is_uniprocessor = ((s[1].count + s[2].count) / s[0].count) < 1.7;
		is_uniprocessor = t->base->is_uniprocessor;
	}
	nsync_mu_unlock (&t->base->testing_mu);
	return (is_uniprocessor);
}